

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManEquivToChoices(Gia_Man_t *p,int nSnapshots)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Rpr_t *pGVar4;
  int *piVar5;
  long lVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar8;
  int iVar9;
  
  if (p->vCos->nSize % nSnapshots != 0) {
    __assert_fail("(Gia_ManCoNum(p) % nSnapshots) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x7bc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
  }
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  iVar9 = p->nObjs;
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar9,4);
  p_00->pReprs = pGVar4;
  piVar5 = (int *)calloc((long)iVar9,4);
  p_00->pNexts = piVar5;
  for (lVar6 = 0; lVar6 < iVar9; lVar6 = lVar6 + 1) {
    p_00->pReprs[lVar6] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar6] | 0xfffffff);
    iVar9 = p->nObjs;
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar9 = 0; iVar9 < p->vCis->nSize; iVar9 = iVar9 + 1) {
    pGVar7 = Gia_ManCi(p,iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar7->Value = uVar1;
  }
  for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
    pGVar7 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar7);
    pObj = Gia_ObjReprObj(p,iVar2);
    if (pObj != (Gia_Obj_t *)0x0) {
      if ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) {
        iVar2 = Gia_ObjIsRo(p,pObj);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x7cc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
        }
      }
      pGVar7->Value = pObj->Value;
    }
  }
  Gia_ManHashAlloc(p_00);
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar7 = Gia_ManCo(p,iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    Gia_ManEquivToChoices_rec(p_00,p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff));
  }
  p_01 = Gia_ManGetDangling(p);
  for (iVar9 = 0; iVar9 < p_01->nSize; iVar9 = iVar9 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar9);
    pGVar7 = Gia_ManObj(p,iVar2);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    Gia_ManEquivToChoices_rec(p_00,p,pGVar7);
  }
  Vec_IntFree(p_01);
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar7 = Gia_ManCo(p,iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    if (iVar9 % nSnapshots == 0) {
      iVar2 = Gia_ObjFanin0Copy(pGVar7);
      Gia_ManAppendCo(p_00,iVar2);
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManRemoveBadChoices(p_00);
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManEquivToChoices( Gia_Man_t * p, int nSnapshots )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    int i;
//Gia_ManEquivPrintClasses( p, 0, 0 );
    assert( (Gia_ManCoNum(p) % nSnapshots) == 0 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    pNew->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            assert( Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr) );
            pObj->Value = pRepr->Value;
        }
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    vNodes = Gia_ManGetDangling( p );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, pObj );
    Vec_IntFree( vNodes );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nSnapshots == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManRemoveBadChoices( pNew );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    return pNew;
}